

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O2

void __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::handleExtremes(SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *this,SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *lp)

{
  uint *puVar1;
  pointer pnVar2;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar3;
  int t;
  undefined1 auVar4 [8];
  int t_00;
  Tolerances *pTVar5;
  undefined8 uVar6;
  type_conflict5 tVar7;
  bool bVar8;
  int t_01;
  int t_02;
  uint uVar9;
  double *pdVar10;
  ulong *puVar11;
  FreeConstraintPS *this_00;
  SPxOut *pSVar12;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar13;
  int *piVar14;
  bool *pbVar15;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *arg;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *arg_00;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *extraout_RDX;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *extraout_RDX_00;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *extraout_RDX_01;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *extraout_RDX_02;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *extraout_RDX_03;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *extraout_RDX_04;
  Item *this_01;
  SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar16;
  uint uVar17;
  int t_03;
  Item *this_02;
  ulong uVar18;
  Real eps;
  double dVar19;
  ulong uVar20;
  Verbosity old_verbosity_2;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_2;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_3;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  maxVal;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  tol;
  Verbosity old_verbosity;
  undefined1 local_738 [16];
  uint local_728 [2];
  uint auStack_720 [2];
  uint local_718 [2];
  int local_710;
  bool local_70c [4];
  ulong local_708;
  SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_700;
  undefined1 local_6f8 [16];
  uint local_6e8 [2];
  uint auStack_6e0 [2];
  uint local_6d8 [2];
  int local_6d0;
  bool local_6cc [4];
  undefined8 local_6c8;
  ulong local_6b8;
  undefined4 local_6ac;
  undefined1 local_6a8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_6a0;
  uint local_698 [2];
  uint auStack_690 [2];
  uint local_688 [2];
  int local_680;
  bool local_67c;
  ulong local_678;
  int local_66c;
  Tolerances *local_668;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_660;
  uint local_658 [2];
  uint auStack_650 [2];
  uint local_648 [2];
  int local_640;
  bool local_63c;
  ulong local_638;
  Tolerances *local_628;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_620;
  uint local_618 [3];
  undefined3 uStack_60b;
  uint local_608;
  undefined3 uStack_603;
  int local_600;
  bool local_5fc;
  ulong local_5f8;
  Tolerances *local_5e8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_5e0;
  uint local_5d8 [3];
  undefined3 uStack_5cb;
  uint local_5c8;
  undefined3 uStack_5c3;
  int local_5c0;
  bool local_5bc;
  undefined8 local_5b8;
  ulong local_5a8;
  __shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *local_5a0;
  __shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> local_598;
  undefined1 local_588 [16];
  uint local_578 [2];
  uint auStack_570 [2];
  uint local_568 [2];
  int local_560;
  bool local_55c;
  ulong local_558;
  Tolerances *local_548;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_540;
  uint local_538 [2];
  uint auStack_530 [2];
  uint local_528 [2];
  int local_520;
  bool local_51c;
  ulong local_518;
  Tolerances *local_508;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_500;
  uint local_4f8 [2];
  uint auStack_4f0 [2];
  uint local_4e8 [2];
  int local_4e0;
  bool local_4dc;
  ulong local_4d8;
  Tolerances *local_4c8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_4c0;
  uint local_4b8 [2];
  uint auStack_4b0 [2];
  uint local_4a8 [2];
  int local_4a0;
  bool local_49c;
  fpclass_type local_498;
  int32_t iStack_494;
  Tolerances *local_488;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_480;
  uint local_478 [2];
  uint auStack_470 [2];
  uint local_468 [2];
  int local_460;
  bool local_45c;
  ulong local_458;
  Tolerances *local_448;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_440;
  uint local_438 [2];
  uint auStack_430 [2];
  uint local_428 [2];
  int local_420;
  bool local_41c;
  ulong local_418;
  Tolerances *local_408;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_400;
  uint local_3f8 [2];
  uint auStack_3f0 [2];
  uint local_3e8 [2];
  int local_3e0;
  bool local_3dc;
  fpclass_type local_3d8;
  int32_t iStack_3d4;
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  undefined8 local_3a8;
  int local_3a0;
  undefined1 local_39c;
  undefined8 local_398;
  Tolerances *local_388;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_380;
  uint local_378 [2];
  uint auStack_370 [2];
  uint local_368 [2];
  int local_360;
  byte local_35c;
  ulong local_358;
  Tolerances *local_348;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_340;
  uint local_338 [2];
  uint auStack_330 [2];
  uint local_328 [2];
  int local_320;
  byte local_31c;
  ulong local_318;
  Tolerances *local_308;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_300;
  uint local_2f8 [2];
  uint auStack_2f0 [2];
  uint local_2e8 [2];
  int local_2e0;
  bool local_2dc;
  ulong local_2d8;
  Tolerances *local_2c8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_2c0;
  uint local_2b8 [2];
  uint auStack_2b0 [2];
  uint local_2a8 [2];
  int local_2a0;
  bool local_29c;
  ulong local_298;
  Tolerances *local_288;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_280;
  uint local_278 [2];
  uint auStack_270 [2];
  uint local_268 [2];
  int local_260;
  bool local_25c;
  ulong local_258;
  Tolerances *local_248;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_240;
  uint local_238 [2];
  uint auStack_230 [2];
  uint local_228 [2];
  int local_220;
  bool local_21c;
  ulong local_218;
  Tolerances *local_208;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_200;
  uint local_1f8 [2];
  uint auStack_1f0 [2];
  uint local_1e8 [2];
  int local_1e0;
  bool local_1dc;
  ulong local_1d8;
  Tolerances *local_1c8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_1c0;
  uint local_1b8 [2];
  uint auStack_1b0 [2];
  uint local_1a8 [2];
  int local_1a0;
  bool local_19c;
  ulong local_198;
  cpp_dec_float<50U,_int,_void> local_188;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_148;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_110;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_d8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_a0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_68;
  
  pdVar10 = (double *)infinity();
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
            ((cpp_dec_float<50U,_int,_void> *)&local_5e8,*pdVar10,(type *)0x0);
  local_6f8._0_8_ = (Tolerances *)0x4014000000000000;
  local_5f8 = 0xa00000000;
  local_628 = (Tolerances *)0x0;
  p_Stack_620 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_618[0] = 0;
  local_618[1] = 0;
  stack0xfffffffffffff9f0 = 0;
  uStack_60b = 0;
  _local_608 = 0;
  uStack_603 = 0;
  local_600 = 0;
  local_5fc = false;
  boost::multiprecision::default_ops::
  eval_divide_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,double>
            ((cpp_dec_float<50U,_int,_void> *)&local_628,(cpp_dec_float<50U,_int,_void> *)&local_5e8
             ,(double *)local_6f8);
  feastol((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *)local_6f8,this);
  local_738._0_8_ = (Tolerances *)0x3f847ae147ae147b;
  local_5b8 = 0xa00000000;
  local_5e8 = (Tolerances *)0x0;
  p_Stack_5e0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_5d8[0] = 0;
  local_5d8[1] = 0;
  stack0xfffffffffffffa30 = 0;
  uStack_5cb = 0;
  _local_5c8 = 0;
  uStack_5c3 = 0;
  local_5c0 = 0;
  local_5bc = false;
  boost::multiprecision::default_ops::
  eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,double>
            ((cpp_dec_float<50U,_int,_void> *)&local_5e8,(cpp_dec_float<50U,_int,_void> *)local_6f8,
             (double *)local_738);
  epsZero((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *)local_738,this);
  tVar7 = boost::multiprecision::operator<
                    ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)&local_5e8,
                     (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)local_738);
  if (tVar7) {
    epsZero((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
             *)local_6f8,this);
    local_5b8._0_4_ = (fpclass_type)local_6c8;
    local_5b8._4_4_ = local_6c8._4_4_;
  }
  else {
    local_6d8[1]._1_3_ = uStack_5c3;
    local_6d8._0_5_ = _local_5c8;
    auStack_6e0[1]._1_3_ = uStack_5cb;
    auStack_6e0._0_5_ = stack0xfffffffffffffa30;
    local_6e8[0] = local_5d8[0];
    local_6e8[1] = local_5d8[1];
    local_6f8._0_8_ = local_5e8;
    local_6f8._8_8_ = p_Stack_5e0;
    local_6d0 = local_5c0;
    local_6cc[0] = local_5bc;
    local_6c8 = local_5b8;
  }
  _local_5c8 = local_6d8._0_5_;
  uStack_5c3 = local_6d8[1]._1_3_;
  local_5d8[0] = local_6e8[0];
  local_5d8[1] = local_6e8[1];
  stack0xfffffffffffffa30 = auStack_6e0._0_5_;
  uStack_5cb = auStack_6e0[1]._1_3_;
  local_5e8 = (Tolerances *)local_6f8._0_8_;
  p_Stack_5e0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_6f8._8_8_;
  uVar17 = (lp->
           super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).
           super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           .set.thenum;
  local_5a0 = &(this->
               super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>;
  t_01 = 0;
  local_5a8 = 0;
  local_700 = this;
  local_5c0 = local_6d0;
  local_5bc = local_6cc[0];
  while (0 < (int)uVar17) {
    uVar17 = uVar17 - 1;
    pnVar2 = (lp->
             super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).left.val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_6d8 = *(uint (*) [2])(pnVar2[uVar17].m_backend.data._M_elems + 8);
    local_6f8._0_8_ = *(undefined8 *)&pnVar2[uVar17].m_backend.data;
    local_6f8._8_8_ = *(undefined8 *)(pnVar2[uVar17].m_backend.data._M_elems + 2);
    puVar1 = pnVar2[uVar17].m_backend.data._M_elems + 4;
    local_6e8 = *(uint (*) [2])puVar1;
    auStack_6e0 = *(uint (*) [2])(puVar1 + 2);
    local_6d0 = pnVar2[uVar17].m_backend.exp;
    local_6cc[0] = pnVar2[uVar17].m_backend.neg;
    local_6c8._0_4_ = pnVar2[uVar17].m_backend.fpclass;
    local_6c8._4_4_ = pnVar2[uVar17].m_backend.prec_elem;
    local_738._0_8_ = 0.0;
    tVar7 = boost::multiprecision::operator!=
                      ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)local_6f8,(double *)local_738);
    if (tVar7) {
      local_1a8[0] = local_6d8[0];
      local_1a8[1] = local_6d8[1];
      local_1b8[0] = local_6e8[0];
      local_1b8[1] = local_6e8[1];
      auStack_1b0[0] = auStack_6e0[0];
      auStack_1b0[1] = auStack_6e0[1];
      local_1c8 = (Tolerances *)local_6f8._0_8_;
      p_Stack_1c0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_6f8._8_8_;
      local_1a0 = local_6d0;
      local_19c = local_6cc[0];
      local_198 = local_6c8;
      epsZero(&local_68,local_700);
      bVar8 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_1c8,&local_68);
      if (!bVar8) goto LAB_00290498;
      dVar19 = 0.0;
LAB_0029059d:
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                ((cpp_dec_float<50U,_int,_void> *)local_738,dVar19,(type *)0x0);
      (*(lp->
        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._vptr_ClassArray[0x33])(lp,(ulong)uVar17,(cpp_dec_float<50U,_int,_void> *)local_738,0);
      t_01 = t_01 + 1;
    }
    else {
LAB_00290498:
      pdVar10 = (double *)infinity();
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                ((cpp_dec_float<50U,_int,_void> *)local_738,-*pdVar10,(type *)0x0);
      tVar7 = boost::multiprecision::operator>
                        ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)local_6f8,
                         (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)local_738);
      if (tVar7) {
        auStack_690[1]._1_3_ = uStack_60b;
        auStack_690._0_5_ = stack0xfffffffffffff9f0;
        local_6a8 = (undefined1  [8])local_628;
        auVar4 = local_6a8;
        _Stack_6a0._M_pi = p_Stack_620;
        local_688[1]._1_3_ = uStack_603;
        local_688._0_5_ = _local_608;
        local_698[0] = local_618[0];
        local_698[1] = local_618[1];
        local_680 = local_600;
        local_67c = local_5fc;
        local_678 = local_5f8;
        local_6a8._0_4_ = SUB84(local_628,0);
        if ((int)local_5f8 != 0 || local_6a8._0_4_ != 0) {
          local_67c = (bool)(local_5fc ^ 1);
        }
        local_6a8 = auVar4;
        tVar7 = boost::multiprecision::operator<
                          ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)local_6f8,
                           (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)local_6a8);
        if (tVar7) {
          pdVar10 = (double *)infinity();
          dVar19 = -*pdVar10;
          goto LAB_0029059d;
        }
      }
      pdVar10 = (double *)infinity();
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                ((cpp_dec_float<50U,_int,_void> *)local_738,*pdVar10,(type *)0x0);
      tVar7 = boost::multiprecision::operator<
                        ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)local_6f8,
                         (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)local_738);
      if ((tVar7) &&
         (tVar7 = boost::multiprecision::operator>
                            ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)local_6f8,
                             (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&local_628), tVar7)) {
        pdVar10 = (double *)infinity();
        dVar19 = *pdVar10;
        goto LAB_0029059d;
      }
    }
    pnVar2 = (lp->
             super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).right.val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_718 = *(uint (*) [2])(pnVar2[uVar17].m_backend.data._M_elems + 8);
    local_738._0_8_ = *(undefined8 *)&pnVar2[uVar17].m_backend.data;
    local_738._8_8_ = *(undefined8 *)(pnVar2[uVar17].m_backend.data._M_elems + 2);
    puVar1 = pnVar2[uVar17].m_backend.data._M_elems + 4;
    local_728 = *(uint (*) [2])puVar1;
    auStack_720 = *(uint (*) [2])(puVar1 + 2);
    local_710 = pnVar2[uVar17].m_backend.exp;
    local_70c[0] = pnVar2[uVar17].m_backend.neg;
    local_708._0_4_ = pnVar2[uVar17].m_backend.fpclass;
    local_708._4_4_ = pnVar2[uVar17].m_backend.prec_elem;
    local_6a8 = (undefined1  [8])0x0;
    tVar7 = boost::multiprecision::operator!=
                      ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)local_738,(double *)local_6a8);
    if (tVar7) {
      local_1e8[0] = local_718[0];
      local_1e8[1] = local_718[1];
      local_1f8[0] = local_728[0];
      local_1f8[1] = local_728[1];
      auStack_1f0[0] = auStack_720[0];
      auStack_1f0[1] = auStack_720[1];
      local_208 = (Tolerances *)local_738._0_8_;
      p_Stack_200 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_738._8_8_;
      local_1e0 = local_710;
      local_1dc = local_70c[0];
      local_1d8 = local_708;
      epsZero(&local_a0,local_700);
      bVar8 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_208,&local_a0);
      if (!bVar8) goto LAB_002906ab;
      dVar19 = 0.0;
LAB_002907b6:
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                ((cpp_dec_float<50U,_int,_void> *)local_6a8,dVar19,(type *)0x0);
      (*(lp->
        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._vptr_ClassArray[0x36])(lp,(ulong)uVar17,(cpp_dec_float<50U,_int,_void> *)local_6a8,0);
      t_01 = t_01 + 1;
    }
    else {
LAB_002906ab:
      pdVar10 = (double *)infinity();
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                ((cpp_dec_float<50U,_int,_void> *)local_6a8,-*pdVar10,(type *)0x0);
      tVar7 = boost::multiprecision::operator>
                        ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)local_738,
                         (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)local_6a8);
      if (tVar7) {
        auStack_650[1]._1_3_ = uStack_60b;
        auStack_650._0_5_ = stack0xfffffffffffff9f0;
        local_668 = local_628;
        pTVar5 = local_668;
        p_Stack_660 = p_Stack_620;
        local_648[1]._1_3_ = uStack_603;
        local_648._0_5_ = _local_608;
        local_658[0] = local_618[0];
        local_658[1] = local_618[1];
        local_640 = local_600;
        local_63c = local_5fc;
        local_638 = local_5f8;
        local_668._0_4_ = (uint)local_628;
        if ((int)local_5f8 != 0 || (uint)local_668 != 0) {
          local_63c = (bool)(local_5fc ^ 1);
        }
        local_668 = pTVar5;
        tVar7 = boost::multiprecision::operator<
                          ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)local_738,
                           (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&local_668);
        if (tVar7) {
          pdVar10 = (double *)infinity();
          dVar19 = -*pdVar10;
          goto LAB_002907b6;
        }
      }
      pdVar10 = (double *)infinity();
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                ((cpp_dec_float<50U,_int,_void> *)local_6a8,*pdVar10,(type *)0x0);
      tVar7 = boost::multiprecision::operator<
                        ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)local_738,
                         (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)local_6a8);
      if ((tVar7) &&
         (tVar7 = boost::multiprecision::operator>
                            ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)local_738,
                             (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&local_628), tVar7)) {
        pdVar10 = (double *)infinity();
        dVar19 = *pdVar10;
        goto LAB_002907b6;
      }
    }
    pnVar2 = (lp->
             super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).left.val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    puVar11 = (ulong *)infinity();
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
              ((cpp_dec_float<50U,_int,_void> *)local_6a8,(double)(*puVar11 ^ (ulong)DAT_002ce2e0),
               (type *)0x0);
    tVar7 = boost::multiprecision::operator<=
                      (pnVar2 + uVar17,
                       (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)local_6a8);
    if (tVar7) {
      pnVar2 = (lp->
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).right.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pdVar10 = (double *)infinity();
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                ((cpp_dec_float<50U,_int,_void> *)&local_668,*pdVar10,(type *)0x0);
      tVar7 = boost::multiprecision::operator>=
                        (pnVar2 + uVar17,
                         (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_668);
      if (tVar7) {
        this_00 = (FreeConstraintPS *)operator_new(0x88);
        std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_598,local_5a0);
        FreeConstraintPS::FreeConstraintPS
                  (this_00,lp,uVar17,(shared_ptr<soplex::Tolerances> *)&local_598);
        std::
        __shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::PostStep,(__gnu_cxx::_Lock_policy)2>
        ::
        __shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::FreeConstraintPS,void>
                  ((__shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::PostStep,(__gnu_cxx::_Lock_policy)2>
                    *)local_6a8,this_00);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_598._M_refcount);
        std::
        vector<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>_>
        ::push_back(&(this->m_hist).data,(value_type *)local_6a8);
        pSVar16 = local_700;
        removeRow(local_700,lp,uVar17);
        local_5a8 = (ulong)((int)local_5a8 + 1);
        piVar14 = (pSVar16->m_stat).data + 1;
        *piVar14 = *piVar14 + 1;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_6a0);
      }
    }
  }
  uVar18 = 0;
  local_6b8 = 0;
  t_02 = 0;
  local_66c = 0;
  pSVar16 = local_700;
  do {
    t_00 = local_66c;
    if ((long)(lp->
              super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .set.thenum <= (long)uVar18) {
      t = (int)local_6b8;
      t_03 = (int)local_5a8;
      if (0 < t + t_02 + t_03 + t_01 + local_66c) {
        piVar14 = &(pSVar16->
                   super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).m_remRows;
        *piVar14 = *piVar14 + t_03;
        piVar14 = &(pSVar16->
                   super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).m_remNzos;
        *piVar14 = *piVar14 + local_66c;
        piVar14 = &(pSVar16->
                   super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).m_chgLRhs;
        *piVar14 = *piVar14 + t_01;
        piVar14 = &(pSVar16->
                   super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).m_chgBnds;
        *piVar14 = *piVar14 + t_02;
        pSVar12 = (pSVar16->
                  super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).spxout;
        if ((pSVar12 != (SPxOut *)0x0) && (3 < (int)pSVar12->m_verbosity)) {
          local_6f8._0_4_ = pSVar12->m_verbosity;
          local_738._0_4_ = 4;
          (*pSVar12->_vptr_SPxOut[2])();
          pSVar12 = soplex::operator<<((pSVar16->
                                       super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                       ).spxout,"Simplifier (extremes) removed ");
          pSVar12 = soplex::operator<<(pSVar12,t_03);
          pSVar12 = soplex::operator<<(pSVar12," rows, ");
          pSVar12 = soplex::operator<<(pSVar12,t_00);
          pSVar12 = soplex::operator<<(pSVar12," non-zeros, ");
          pSVar12 = soplex::operator<<(pSVar12,t_02);
          pSVar12 = soplex::operator<<(pSVar12," col bounds, ");
          pSVar12 = soplex::operator<<(pSVar12,t_01);
          pSVar12 = soplex::operator<<(pSVar12," row bounds, ");
          pSVar12 = soplex::operator<<(pSVar12,t);
          pSVar12 = soplex::operator<<(pSVar12," objective coefficients");
          std::endl<char,std::char_traits<char>>(pSVar12->m_streams[pSVar12->m_verbosity]);
          pSVar12 = (pSVar16->
                    super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).spxout;
          (*pSVar12->_vptr_SPxOut[2])(pSVar12,local_6f8);
        }
      }
      return;
    }
    pnVar2 = (lp->
             super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).low.val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_6d8 = *(uint (*) [2])(pnVar2[uVar18].m_backend.data._M_elems + 8);
    local_6f8._0_8_ = *(undefined8 *)&pnVar2[uVar18].m_backend.data;
    local_6f8._8_8_ = *(undefined8 *)(pnVar2[uVar18].m_backend.data._M_elems + 2);
    puVar1 = pnVar2[uVar18].m_backend.data._M_elems + 4;
    local_6e8 = *(uint (*) [2])puVar1;
    auStack_6e0 = *(uint (*) [2])(puVar1 + 2);
    local_6d0 = pnVar2[uVar18].m_backend.exp;
    local_6cc[0] = pnVar2[uVar18].m_backend.neg;
    local_6c8._0_4_ = pnVar2[uVar18].m_backend.fpclass;
    local_6c8._4_4_ = pnVar2[uVar18].m_backend.prec_elem;
    local_738._0_8_ = 0.0;
    tVar7 = boost::multiprecision::operator!=
                      ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)local_6f8,(double *)local_738);
    if (tVar7) {
      local_228[0] = local_6d8[0];
      local_228[1] = local_6d8[1];
      local_238[0] = local_6e8[0];
      local_238[1] = local_6e8[1];
      auStack_230[0] = auStack_6e0[0];
      auStack_230[1] = auStack_6e0[1];
      local_248 = (Tolerances *)local_6f8._0_8_;
      p_Stack_240 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_6f8._8_8_;
      local_220 = local_6d0;
      local_21c = local_6cc[0];
      local_218 = local_6c8;
      epsZero(&local_d8,pSVar16);
      bVar8 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_248,&local_d8);
      if (!bVar8) goto LAB_00290a4f;
      dVar19 = 0.0;
LAB_00290b58:
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                ((cpp_dec_float<50U,_int,_void> *)local_738,dVar19,(type *)0x0);
      (*(lp->
        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._vptr_ClassArray[0x2a])(lp,uVar18,(cpp_dec_float<50U,_int,_void> *)local_738,0);
      t_02 = t_02 + 1;
    }
    else {
LAB_00290a4f:
      pdVar10 = (double *)infinity();
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                ((cpp_dec_float<50U,_int,_void> *)local_738,-*pdVar10,(type *)0x0);
      tVar7 = boost::multiprecision::operator>
                        ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)local_6f8,
                         (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)local_738);
      if (tVar7) {
        auStack_690[1]._1_3_ = uStack_60b;
        auStack_690._0_5_ = stack0xfffffffffffff9f0;
        local_6a8 = (undefined1  [8])local_628;
        auVar4 = local_6a8;
        _Stack_6a0._M_pi = p_Stack_620;
        local_688[1]._1_3_ = uStack_603;
        local_688._0_5_ = _local_608;
        local_698[0] = local_618[0];
        local_698[1] = local_618[1];
        local_680 = local_600;
        local_67c = local_5fc;
        local_678 = local_5f8;
        local_6a8._0_4_ = SUB84(local_628,0);
        if ((int)local_5f8 != 0 || local_6a8._0_4_ != 0) {
          local_67c = (bool)(local_5fc ^ 1);
        }
        local_6a8 = auVar4;
        tVar7 = boost::multiprecision::operator<
                          ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)local_6f8,
                           (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)local_6a8);
        if (tVar7) {
          pdVar10 = (double *)infinity();
          dVar19 = -*pdVar10;
          goto LAB_00290b58;
        }
      }
      pdVar10 = (double *)infinity();
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                ((cpp_dec_float<50U,_int,_void> *)local_738,*pdVar10,(type *)0x0);
      tVar7 = boost::multiprecision::operator<
                        ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)local_6f8,
                         (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)local_738);
      if ((tVar7) &&
         (tVar7 = boost::multiprecision::operator>
                            ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)local_6f8,
                             (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&local_628), tVar7)) {
        pdVar10 = (double *)infinity();
        dVar19 = *pdVar10;
        goto LAB_00290b58;
      }
    }
    pnVar2 = (lp->
             super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).up.val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_718 = *(uint (*) [2])(pnVar2[uVar18].m_backend.data._M_elems + 8);
    local_738._0_8_ = *(undefined8 *)&pnVar2[uVar18].m_backend.data;
    local_738._8_8_ = *(undefined8 *)(pnVar2[uVar18].m_backend.data._M_elems + 2);
    puVar1 = pnVar2[uVar18].m_backend.data._M_elems + 4;
    local_728 = *(uint (*) [2])puVar1;
    auStack_720 = *(uint (*) [2])(puVar1 + 2);
    local_710 = pnVar2[uVar18].m_backend.exp;
    local_70c[0] = pnVar2[uVar18].m_backend.neg;
    local_708._0_4_ = pnVar2[uVar18].m_backend.fpclass;
    local_708._4_4_ = pnVar2[uVar18].m_backend.prec_elem;
    local_6a8 = (undefined1  [8])0x0;
    tVar7 = boost::multiprecision::operator!=
                      ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)local_738,(double *)local_6a8);
    if (tVar7) {
      local_268[0] = local_718[0];
      local_268[1] = local_718[1];
      local_278[0] = local_728[0];
      local_278[1] = local_728[1];
      auStack_270[0] = auStack_720[0];
      auStack_270[1] = auStack_720[1];
      local_288 = (Tolerances *)local_738._0_8_;
      p_Stack_280 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_738._8_8_;
      local_260 = local_710;
      local_25c = local_70c[0];
      local_258 = local_708;
      epsZero(&local_110,pSVar16);
      bVar8 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_288,&local_110);
      if (!bVar8) goto LAB_00290c5e;
      dVar19 = 0.0;
LAB_00290d59:
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                ((cpp_dec_float<50U,_int,_void> *)local_6a8,dVar19,(type *)0x0);
      (*(lp->
        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._vptr_ClassArray[0x2d])(lp,uVar18,(cpp_dec_float<50U,_int,_void> *)local_6a8,0);
      t_02 = t_02 + 1;
    }
    else {
LAB_00290c5e:
      pdVar10 = (double *)infinity();
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                ((cpp_dec_float<50U,_int,_void> *)local_6a8,-*pdVar10,(type *)0x0);
      tVar7 = boost::multiprecision::operator>
                        ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)local_738,
                         (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)local_6a8);
      if (tVar7) {
        auStack_650[1]._1_3_ = uStack_60b;
        auStack_650._0_5_ = stack0xfffffffffffff9f0;
        local_668 = local_628;
        pTVar5 = local_668;
        p_Stack_660 = p_Stack_620;
        local_648[1]._1_3_ = uStack_603;
        local_648._0_5_ = _local_608;
        local_658[0] = local_618[0];
        local_658[1] = local_618[1];
        local_640 = local_600;
        local_63c = local_5fc;
        local_638 = local_5f8;
        local_668._0_4_ = (uint)local_628;
        if ((int)local_5f8 != 0 || (uint)local_668 != 0) {
          local_63c = (bool)(local_5fc ^ 1);
        }
        local_668 = pTVar5;
        tVar7 = boost::multiprecision::operator<
                          ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)local_738,
                           (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&local_668);
        if (tVar7) {
          pdVar10 = (double *)infinity();
          dVar19 = -*pdVar10;
          goto LAB_00290d59;
        }
      }
      pdVar10 = (double *)infinity();
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                ((cpp_dec_float<50U,_int,_void> *)local_6a8,*pdVar10,(type *)0x0);
      tVar7 = boost::multiprecision::operator<
                        ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)local_738,
                         (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)local_6a8);
      if ((tVar7) &&
         (tVar7 = boost::multiprecision::operator>
                            ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)local_738,
                             (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&local_628), tVar7)) {
        pdVar10 = (double *)infinity();
        dVar19 = *pdVar10;
        goto LAB_00290d59;
      }
    }
    local_2a8[0] = local_6d8[0];
    local_2a8[1] = local_6d8[1];
    local_2b8[0] = local_6e8[0];
    local_2b8[1] = local_6e8[1];
    auStack_2b0[0] = auStack_6e0[0];
    auStack_2b0[1] = auStack_6e0[1];
    local_2c8 = (Tolerances *)local_6f8._0_8_;
    p_Stack_2c0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_6f8._8_8_;
    local_2a0 = local_6d0;
    local_29c = local_6cc[0];
    local_298 = local_6c8;
    local_308 = (Tolerances *)local_738._0_8_;
    p_Stack_300 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_738._8_8_;
    local_2f8[0] = local_728[0];
    local_2f8[1] = local_728[1];
    auStack_2f0[0] = auStack_720[0];
    auStack_2f0[1] = auStack_720[1];
    local_2e8[0] = local_718[0];
    local_2e8[1] = local_718[1];
    local_2e0 = local_710;
    local_2dc = local_70c[0];
    local_2d8 = local_708;
    std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)local_6a8,local_5a0);
    eps = Tolerances::epsilon((Tolerances *)local_6a8);
    bVar8 = NE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                      ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&local_2c8,
                       (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&local_308,eps);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_6a0);
    if (bVar8) {
      local_348 = (Tolerances *)local_6f8._0_8_;
      p_Stack_340 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_6f8._8_8_;
      local_338[0] = local_6e8[0];
      local_338[1] = local_6e8[1];
      auStack_330[0] = auStack_6e0[0];
      auStack_330[1] = auStack_6e0[1];
      local_328[0] = local_6d8[0];
      local_328[1] = local_6d8[1];
      local_320 = local_6d0;
      local_31c = local_6cc[0];
      local_318 = local_6c8;
      boost::multiprecision::abs<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                ((type *)local_6a8,(multiprecision *)&local_348,arg);
      local_6d8[0] = local_688[0];
      local_6d8[1] = local_688[1];
      local_6e8[0] = local_698[0];
      local_6e8[1] = local_698[1];
      auStack_6e0[0] = auStack_690[0];
      auStack_6e0[1] = auStack_690[1];
      local_6f8._0_8_ = local_6a8;
      local_6f8._8_8_ = _Stack_6a0._M_pi;
      local_6d0 = local_680;
      local_6cc[0] = local_67c;
      local_6c8 = local_678;
      local_388 = (Tolerances *)local_738._0_8_;
      p_Stack_380 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_738._8_8_;
      local_378[0] = local_728[0];
      local_378[1] = local_728[1];
      auStack_370[0] = auStack_720[0];
      auStack_370[1] = auStack_720[1];
      local_368[0] = local_718[0];
      local_368[1] = local_718[1];
      local_360 = local_710;
      local_35c = local_70c[0];
      local_358 = local_708;
      boost::multiprecision::abs<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                ((type *)local_6a8,(multiprecision *)&local_388,arg_00);
      local_718[0] = local_688[0];
      local_718[1] = local_688[1];
      local_728[0] = local_698[0];
      local_728[1] = local_698[1];
      auStack_720[0] = auStack_690[0];
      auStack_720[1] = auStack_690[1];
      local_738._0_8_ = local_6a8;
      local_738._8_8_ = _Stack_6a0._M_pi;
      local_710 = local_680;
      local_70c[0] = local_67c;
      local_708 = local_678;
      tVar7 = boost::multiprecision::operator>
                        ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)local_6f8,
                         (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)local_738);
      pnVar13 = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)local_738;
      if (tVar7) {
        pnVar13 = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)local_6f8;
      }
      local_688 = *(uint (*) [2])((pnVar13->m_backend).data._M_elems + 8);
      local_6a8 = *(undefined1 (*) [8])(pnVar13->m_backend).data._M_elems;
      _Stack_6a0._M_pi =
           *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
            ((pnVar13->m_backend).data._M_elems + 2);
      local_698 = *(uint (*) [2])((pnVar13->m_backend).data._M_elems + 4);
      auStack_690 = *(uint (*) [2])((pnVar13->m_backend).data._M_elems + 6);
      piVar14 = &local_710;
      if (tVar7) {
        piVar14 = &local_6d0;
      }
      local_680 = *piVar14;
      pbVar15 = local_70c;
      if (tVar7) {
        pbVar15 = local_6cc;
      }
      local_67c = *pbVar15;
      uVar20 = CONCAT44((int)((uint)tVar7 << 0x1f) >> 0x1f,(int)((uint)tVar7 << 0x1f) >> 0x1f);
      local_678 = ~uVar20 & local_708 | local_6c8 & uVar20;
      local_668 = (Tolerances *)&DAT_3ff0000000000000;
      tVar7 = boost::multiprecision::operator<
                        ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)local_6a8,(double *)&local_668);
      pnVar13 = extraout_RDX;
      if (tVar7) {
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)local_6a8,1.0);
        pnVar13 = extraout_RDX_00;
      }
      this_01 = (lp->
                super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .set.theitem +
                (lp->
                super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .set.thekey[uVar18].idx;
      uVar17 = 0;
      while (pSVar16 = local_700,
            (int)uVar17 <
            (this_01->data).
            super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .memused) {
        pNVar3 = (this_01->data).
                 super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .m_elem;
        local_3a8 = *(undefined8 *)(pNVar3[(int)uVar17].val.m_backend.data._M_elems + 8);
        local_3c8 = *(undefined8 *)pNVar3[(int)uVar17].val.m_backend.data._M_elems;
        uStack_3c0 = *(undefined8 *)(pNVar3[(int)uVar17].val.m_backend.data._M_elems + 2);
        puVar1 = pNVar3[(int)uVar17].val.m_backend.data._M_elems + 4;
        local_3b8 = *(undefined8 *)puVar1;
        uStack_3b0 = *(undefined8 *)(puVar1 + 2);
        local_3a0 = pNVar3[(int)uVar17].val.m_backend.exp;
        local_39c = pNVar3[(int)uVar17].val.m_backend.neg;
        local_398._0_4_ = pNVar3[(int)uVar17].val.m_backend.fpclass;
        local_398._4_4_ = pNVar3[(int)uVar17].val.m_backend.prec_elem;
        boost::multiprecision::abs<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  ((type *)&local_668,(multiprecision *)&local_3c8,pnVar13);
        local_188.fpclass = cpp_dec_float_finite;
        local_188.prec_elem = 10;
        local_188.data._M_elems[0] = 0;
        local_188.data._M_elems[1] = 0;
        local_188.data._M_elems[2] = 0;
        local_188.data._M_elems[3] = 0;
        local_188.data._M_elems[4] = 0;
        local_188.data._M_elems[5] = 0;
        local_188.data._M_elems._24_5_ = 0;
        local_188.data._M_elems[7]._1_3_ = 0;
        local_188.data._M_elems._32_5_ = 0;
        local_188._37_8_ = 0;
        boost::multiprecision::default_ops::
        eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  (&local_188,(cpp_dec_float<50U,_int,_void> *)&local_668,
                   (cpp_dec_float<50U,_int,_void> *)local_6a8);
        local_3e8[1]._1_3_ = uStack_5c3;
        local_3e8._0_5_ = _local_5c8;
        auStack_3f0[1]._1_3_ = uStack_5cb;
        auStack_3f0._0_5_ = stack0xfffffffffffffa30;
        local_3f8[0] = local_5d8[0];
        local_3f8[1] = local_5d8[1];
        local_408 = local_5e8;
        p_Stack_400 = p_Stack_5e0;
        local_3e0 = local_5c0;
        local_3dc = local_5bc;
        local_3d8 = (fpclass_type)local_5b8;
        iStack_3d4 = local_5b8._4_4_;
        bVar8 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                          ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&local_188,
                           (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&local_408);
        if (bVar8) {
          this_02 = (lp->
                    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).
                    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .set.theitem +
                    (lp->
                    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).
                    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .set.thekey
                    [(this_01->data).
                     super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .m_elem[(int)uVar17].idx].idx;
          uVar9 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::pos((SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         *)this_02,(int)uVar18);
          if (-1 < (int)uVar9) {
            SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::remove((SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *)this_02,(char *)(ulong)uVar9);
          }
          SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::remove((SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *)this_01,(char *)(ulong)uVar17);
          local_66c = local_66c + 1;
          pnVar13 = extraout_RDX_01;
        }
        else {
          tVar7 = boost::multiprecision::operator>
                            ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&local_668,
                             (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&local_628);
          if (tVar7) {
            pSVar12 = (local_700->
                      super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).spxout;
            pnVar13 = extraout_RDX_02;
            if ((pSVar12 != (SPxOut *)0x0) && (0 < (int)pSVar12->m_verbosity)) {
              local_588._0_4_ = pSVar12->m_verbosity;
              local_6ac = 1;
              (*pSVar12->_vptr_SPxOut[2])(pSVar12,&local_6ac);
              pSVar16 = local_700;
              pSVar12 = soplex::operator<<((local_700->
                                           super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                           ).spxout,"WMAISM05 Warning! Big matrix coefficient ");
              local_448 = local_668;
              p_Stack_440 = p_Stack_660;
              local_438[0] = local_658[0];
              local_438[1] = local_658[1];
              auStack_430[0] = auStack_650[0];
              auStack_430[1] = auStack_650[1];
              local_428[0] = local_648[0];
              local_428[1] = local_648[1];
              local_420 = local_640;
              local_41c = local_63c;
              local_418 = local_638;
              pnVar13 = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)&local_448;
LAB_002914db:
              pSVar12 = soplex::operator<<(pSVar12,pnVar13);
              std::endl<char,std::char_traits<char>>(pSVar12->m_streams[pSVar12->m_verbosity]);
              pSVar12 = (pSVar16->
                        super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).spxout;
              (*pSVar12->_vptr_SPxOut[2])(pSVar12,local_588);
              pnVar13 = extraout_RDX_04;
            }
          }
          else {
            local_468[0] = local_648[0];
            local_468[1] = local_648[1];
            local_478[0] = local_658[0];
            local_478[1] = local_658[1];
            auStack_470[0] = auStack_650[0];
            auStack_470[1] = auStack_650[1];
            local_488 = local_668;
            p_Stack_480 = p_Stack_660;
            local_460 = local_640;
            local_45c = local_63c;
            local_458 = local_638;
            auStack_4b0[1]._1_3_ = uStack_5cb;
            auStack_4b0._0_5_ = stack0xfffffffffffffa30;
            local_4c8 = local_5e8;
            p_Stack_4c0 = p_Stack_5e0;
            local_4b8[0] = local_5d8[0];
            local_4b8[1] = local_5d8[1];
            local_4a8[1]._1_3_ = uStack_5c3;
            local_4a8._0_5_ = _local_5c8;
            local_4a0 = local_5c0;
            local_49c = local_5bc;
            local_498 = (fpclass_type)local_5b8;
            iStack_494 = local_5b8._4_4_;
            bVar8 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                              ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)&local_488,
                               (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)&local_4c8);
            pnVar13 = extraout_RDX_03;
            if (((bVar8) &&
                (pSVar12 = (local_700->
                           super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           ).spxout, pSVar12 != (SPxOut *)0x0)) && (0 < (int)pSVar12->m_verbosity))
            {
              local_588._0_4_ = pSVar12->m_verbosity;
              local_6ac = 1;
              (*pSVar12->_vptr_SPxOut[2])(pSVar12,&local_6ac);
              pSVar16 = local_700;
              pSVar12 = soplex::operator<<((local_700->
                                           super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                           ).spxout,"WMAISM06 Warning! Tiny matrix coefficient ");
              local_508 = local_668;
              p_Stack_500 = p_Stack_660;
              local_4f8[0] = local_658[0];
              local_4f8[1] = local_658[1];
              auStack_4f0[0] = auStack_650[0];
              auStack_4f0[1] = auStack_650[1];
              local_4e8[0] = local_648[0];
              local_4e8[1] = local_648[1];
              local_4e0 = local_640;
              local_4dc = local_63c;
              local_4d8 = local_638;
              pnVar13 = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)&local_508;
              goto LAB_002914db;
            }
          }
          uVar17 = uVar17 + 1;
        }
      }
    }
    SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::obj((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *)local_6a8,lp,(int)uVar18);
    local_668 = (Tolerances *)0x0;
    tVar7 = boost::multiprecision::operator!=
                      ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)local_6a8,(double *)&local_668);
    if (tVar7) {
      local_528[0] = local_688[0];
      local_528[1] = local_688[1];
      local_538[0] = local_698[0];
      local_538[1] = local_698[1];
      auStack_530[0] = auStack_690[0];
      auStack_530[1] = auStack_690[1];
      local_548 = (Tolerances *)local_6a8;
      p_Stack_540 = _Stack_6a0._M_pi;
      local_520 = local_680;
      local_51c = local_67c;
      local_518 = local_678;
      epsZero(&local_148,pSVar16);
      bVar8 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_548,&local_148);
      if (!bVar8) goto LAB_002915e2;
      dVar19 = 0.0;
LAB_002916e5:
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                ((cpp_dec_float<50U,_int,_void> *)&local_668,dVar19,(type *)0x0);
      (*(lp->
        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._vptr_ClassArray[0x24])
                (lp,uVar18 & 0xffffffff,(cpp_dec_float<50U,_int,_void> *)&local_668,0);
      local_6b8 = (ulong)((int)local_6b8 + 1);
    }
    else {
LAB_002915e2:
      pdVar10 = (double *)infinity();
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                ((cpp_dec_float<50U,_int,_void> *)&local_668,-*pdVar10,(type *)0x0);
      tVar7 = boost::multiprecision::operator>
                        ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)local_6a8,
                         (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_668);
      if (tVar7) {
        auStack_570[1]._1_3_ = uStack_60b;
        auStack_570._0_5_ = stack0xfffffffffffff9f0;
        local_588._0_8_ = local_628;
        uVar6 = local_588._0_8_;
        local_588._8_8_ = p_Stack_620;
        local_568[1]._1_3_ = uStack_603;
        local_568._0_5_ = _local_608;
        local_578[0] = local_618[0];
        local_578[1] = local_618[1];
        local_560 = local_600;
        local_55c = local_5fc;
        local_558 = local_5f8;
        local_588._0_4_ = SUB84(local_628,0);
        if ((int)local_5f8 != 0 || local_588._0_4_ != 0) {
          local_55c = (bool)(local_5fc ^ 1);
        }
        local_588._0_8_ = uVar6;
        tVar7 = boost::multiprecision::operator<
                          ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)local_6a8,
                           (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)local_588);
        if (tVar7) {
          puVar11 = (ulong *)infinity();
          dVar19 = (double)(*puVar11 ^ (ulong)DAT_002ce2e0);
          goto LAB_002916e5;
        }
      }
      pdVar10 = (double *)infinity();
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                ((cpp_dec_float<50U,_int,_void> *)&local_668,*pdVar10,(type *)0x0);
      tVar7 = boost::multiprecision::operator<
                        ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)local_6a8,
                         (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_668);
      if ((tVar7) &&
         (tVar7 = boost::multiprecision::operator>
                            ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)local_6a8,
                             (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&local_628), tVar7)) {
        pdVar10 = (double *)infinity();
        dVar19 = *pdVar10;
        goto LAB_002916e5;
      }
    }
    uVar18 = uVar18 + 1;
  } while( true );
}

Assistant:

void SPxMainSM<R>::handleExtremes(SPxLPBase<R>& lp)
{

   // This method handles extreme value of the given LP by
   //
   // 1. setting numbers of very small absolute values to zero and
   // 2. setting numbers of very large absolute values to R(-infinity) or +R(infinity), respectively.

   R maxVal  = R(infinity) / 5.0;
   R tol = feastol() * 1e-2;
   tol = (tol < this->epsZero()) ? this->epsZero() : tol;
   int  remRows = 0;
   int  remNzos = 0;
   int  chgBnds = 0;
   int  chgLRhs = 0;
   int  objCnt  = 0;

   for(int i = lp.nRows() - 1; i >= 0; --i)
   {
      // lhs
      R lhs = lp.lhs(i);

      if(lhs != 0.0 && isZero(lhs, this->epsZero()))
      {
         lp.changeLhs(i, R(0.0));
         ++chgLRhs;
      }
      else if(lhs > R(-infinity) && lhs < -maxVal)
      {
         lp.changeLhs(i, R(-infinity));
         ++chgLRhs;
      }
      else if(lhs <  R(infinity) && lhs >  maxVal)
      {
         lp.changeLhs(i,  R(infinity));
         ++chgLRhs;
      }

      // rhs
      R rhs = lp.rhs(i);

      if(rhs != 0.0 && isZero(rhs, this->epsZero()))
      {
         lp.changeRhs(i, R(0.0));
         ++chgLRhs;
      }
      else if(rhs > R(-infinity) && rhs < -maxVal)
      {
         lp.changeRhs(i, R(-infinity));
         ++chgLRhs;
      }
      else if(rhs <  R(infinity) && rhs >  maxVal)
      {
         lp.changeRhs(i,  R(infinity));
         ++chgLRhs;
      }

      if(lp.lhs(i) <= R(-infinity) && lp.rhs(i) >= R(infinity))
      {
         std::shared_ptr<PostStep> ptr(new FreeConstraintPS(lp, i, this->_tolerances));
         m_hist.append(ptr);

         removeRow(lp, i);
         ++remRows;

         ++m_stat[FREE_ROW];
      }
   }

   for(int j = 0; j < lp.nCols(); ++j)
   {
      // lower bound
      R lo = lp.lower(j);

      if(lo != 0.0 && isZero(lo, this->epsZero()))
      {
         lp.changeLower(j, R(0.0));
         ++chgBnds;
      }
      else if(lo > R(-infinity) && lo < -maxVal)
      {
         lp.changeLower(j, R(-infinity));
         ++chgBnds;
      }
      else if(lo <  R(infinity) && lo >  maxVal)
      {
         lp.changeLower(j,  R(infinity));
         ++chgBnds;
      }

      // upper bound
      R up = lp.upper(j);

      if(up != 0.0 && isZero(up, this->epsZero()))
      {
         lp.changeUpper(j, R(0.0));
         ++chgBnds;
      }
      else if(up > R(-infinity) && up < -maxVal)
      {
         lp.changeUpper(j, R(-infinity));
         ++chgBnds;
      }
      else if(up <  R(infinity) && up >  maxVal)
      {
         lp.changeUpper(j,  R(infinity));
         ++chgBnds;
      }

      // fixed columns will be eliminated later
      if(NE(lo, up, this->tolerances()->epsilon()))
      {
         lo = spxAbs(lo);
         up = spxAbs(up);

         R absBnd = (lo > up) ? lo : up;

         if(absBnd < 1.0)
            absBnd = 1.0;

         // non-zeros
         SVectorBase<R>& col = lp.colVector_w(j);
         int        i = 0;

         while(i < col.size())
         {
            R aij = spxAbs(col.value(i));

            if(isZero(aij * absBnd, tol))
            {
               SVectorBase<R>& row = lp.rowVector_w(col.index(i));
               int row_j = row.pos(j);

               // this changes col.size()
               if(row_j >= 0)
                  row.remove(row_j);

               col.remove(i);

               SPxOut::debug(this, "IMAISM04 aij={}  removed, absBnd={} \n", aij, absBnd);
               ++remNzos;
            }
            else
            {
               if(aij > maxVal)
               {
                  SPX_MSG_WARNING((*this->spxout),
                                  (*this->spxout) << "WMAISM05 Warning! Big matrix coefficient " << aij
                                  << std::endl);
               }
               else if(isZero(aij, tol))
               {
                  SPX_MSG_WARNING((*this->spxout),
                                  (*this->spxout) << "WMAISM06 Warning! Tiny matrix coefficient " << aij
                                  << std::endl);
               }

               ++i;
            }
         }
      }

      // objective
      R obj = lp.obj(j);

      if(obj != 0.0 && isZero(obj, this->epsZero()))
      {
         lp.changeObj(j, R(0.0));
         ++objCnt;
      }
      else if(obj > R(-infinity) && obj < -maxVal)
      {
         lp.changeObj(j, R(-infinity));
         ++objCnt;
      }
      else if(obj <  R(infinity) && obj >  maxVal)
      {
         lp.changeObj(j,  R(infinity));
         ++objCnt;
      }
   }

   if(remRows + remNzos + chgLRhs + chgBnds + objCnt > 0)
   {
      this->m_remRows += remRows;
      this->m_remNzos += remNzos;
      this->m_chgLRhs += chgLRhs;
      this->m_chgBnds += chgBnds;

      SPX_MSG_INFO2((*this->spxout), (*this->spxout) << "Simplifier (extremes) removed "
                    << remRows << " rows, "
                    << remNzos << " non-zeros, "
                    << chgBnds << " col bounds, "
                    << chgLRhs << " row bounds, "
                    << objCnt  << " objective coefficients" << std::endl;)
   }

   assert(lp.isConsistent());
}